

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

la_proto_node * la_miam_core_v1_ack_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen)

{
  undefined4 uVar1;
  void *pvVar2;
  la_proto_node *plVar3;
  
  pvVar2 = la_xcalloc(1,0x78,
                      "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                      ,0x271,"la_miam_core_v1_ack_parse");
  plVar3 = la_proto_node_new();
  plVar3->td = &la_DEF_miam_core_v1_ack_pdu;
  plVar3->data = pvVar2;
  plVar3->next = (la_proto_node *)0x0;
  if (hdrlen < 0x14) {
    *(byte *)((long)pvVar2 + 8) = *(byte *)((long)pvVar2 + 8) | 8;
  }
  else {
    *(uint *)((long)pvVar2 + 0xc) = (uint)hdrbuf[3] | (uint)hdrbuf[2] << 8 | (uint)hdrbuf[1] << 0x10
    ;
    uVar1 = *(undefined4 *)(hdrbuf + 7);
    *(undefined4 *)((long)pvVar2 + 0x14) = *(undefined4 *)(hdrbuf + 4);
    *(undefined4 *)((long)pvVar2 + 0x17) = uVar1;
    *(undefined1 *)((long)pvVar2 + 0x1b) = 0;
    *(uint8_t *)((long)pvVar2 + 0x1c) = hdrbuf[0xb] >> 1;
    *(uint8_t *)((long)pvVar2 + 0x1d) = hdrbuf[0xc] >> 4;
    *(undefined4 *)((long)pvVar2 + 0x1e) = *(undefined4 *)(hdrbuf + 0x10);
  }
  return plVar3;
}

Assistant:

static la_proto_node *la_miam_core_v1_ack_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf, int bodylen) {
	la_assert(hdrbuf != NULL);
	LA_UNUSED(bodybuf);
	LA_UNUSED(bodylen);

	LA_NEW(la_miam_core_v1_ack_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_v1_ack_pdu;
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 20) {
		la_debug_print(D_ERROR, "Header too short: %d < 20\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += 4; hdrlen -=4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	pdu->msg_ack_num = (hdrbuf[0] >> 1) & 0x7f;
	hdrbuf++; hdrlen--;

	pdu->ack_xfer_result = (hdrbuf[0] >> 4) & 0xf;
	la_debug_print(D_INFO, "msg_ack_num: %u ack_xfer_result: 0x%x\n", pdu->msg_ack_num, pdu->ack_xfer_result);
	hdrbuf += 4; hdrlen -= 4;

	memcpy(pdu->crc, hdrbuf, LA_MIAM_CORE_V1_CRC_LEN);
	hdrbuf += LA_MIAM_CORE_V1_CRC_LEN; hdrlen -= LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen > 0) {
		la_debug_print(D_ERROR, "Warning: %u bytes left after MIAM header\n", hdrlen);
	}
end:
	return node;
}